

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall Lexer::mustGetAnyOf(Lexer *this,List<Token> *toks)

{
  Token TVar1;
  Token *pTVar2;
  bool bVar3;
  Token TVar4;
  Token *pTVar5;
  TokenInfo *tok;
  Token *pTVar6;
  Token *pTVar7;
  Token *tokType;
  List<Token> *__range1;
  _Map_pointer ppTVar8;
  _Map_pointer local_a0;
  String toknames;
  String local_70;
  string local_50 [32];
  
  bVar3 = next(this,Any);
  if (!bVar3) {
    error<>("unexpected EOF");
  }
  pTVar6 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pTVar7 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  ppTVar8 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  pTVar2 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while( true ) {
    if (pTVar6 == pTVar2) {
      toknames._string._M_dataplus._M_p = (pointer)&toknames._string.field_2;
      toknames._string._M_string_length = 0;
      toknames._string.field_2._M_local_buf[0] = '\0';
      pTVar6 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pTVar7 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      local_a0 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      pTVar2 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      while (pTVar6 != pTVar2) {
        pTVar5 = List<Token>::last(toks);
        if ((pTVar6 == pTVar5) || (*toknames._string._M_dataplus._M_p != '\0')) {
          std::__cxx11::string::append((char *)&toknames);
        }
        DescribeTokenType((String *)local_50,*pTVar6);
        std::__cxx11::string::append((char *)&toknames);
        std::__cxx11::string::~string(local_50);
        pTVar6 = pTVar6 + 1;
        if (pTVar6 == pTVar7) {
          pTVar6 = local_a0[1];
          local_a0 = local_a0 + 1;
          pTVar7 = pTVar6 + 0x80;
        }
      }
      tok = token(this);
      DescribeToken(&local_70,tok);
      error<String,String>("expected %1, got %2",&toknames,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&toknames);
      return;
    }
    TVar1 = *pTVar6;
    TVar4 = tokenType(this);
    if (TVar4 == TVar1) break;
    pTVar6 = pTVar6 + 1;
    if (pTVar6 == pTVar7) {
      pTVar6 = ppTVar8[1];
      ppTVar8 = ppTVar8 + 1;
      pTVar7 = pTVar6 + 0x80;
    }
  }
  return;
}

Assistant:

void Lexer::mustGetAnyOf (const List<Token>& toks)
{
	if (!next())
		error ("unexpected EOF");

	for (Token tok : toks)
		if (tokenType() == tok)
			return;

	String toknames;

	for (const Token& tokType : toks)
	{
		if (&tokType == &toks.last())
			toknames += " or ";
		elif (toknames.isEmpty() == false)
			toknames += ", ";

		toknames += DescribeTokenType (tokType);
	}

	error ("expected %1, got %2", toknames, DescribeToken (token()));
}